

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this,
          uint *key,ExternFuncInfo **value)

{
  Node *pNVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  int iVar6;
  
  uVar3 = *key;
  if (uVar3 == 0) {
    __assertion = "key != Key()";
    uVar3 = 0x3b;
  }
  else {
    uVar4 = this->bucketCount;
    if (uVar4 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar4 = this->bucketCount;
      uVar3 = *key;
    }
    uVar5 = uVar3 * -0x61c88647;
    for (iVar6 = 1; iVar6 - uVar4 != 1; iVar6 = iVar6 + 1) {
      uVar5 = uVar5 & uVar4 - 1;
      pNVar1 = this->data + uVar5;
      uVar2 = this->data[uVar5].key;
      if (uVar2 == 0) {
        pNVar1->key = uVar3;
        pNVar1->value = *value;
        this->count = this->count + 1;
        return;
      }
      if (uVar2 == uVar3) {
        pNVar1->value = *value;
        return;
      }
      uVar5 = uVar5 + iVar6;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar3 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar3,
                "void SmallDenseMap<unsigned int, ExternFuncInfo *, SmallDenseMapUnsignedHasher, 32>::insert(const Key &, const Value &) [Key = unsigned int, Value = ExternFuncInfo *, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}